

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_implicit_tree(lyd_node *tree,uint32_t implicit_options,lyd_node **diff)

{
  anon_union_8_3_0df1e6ad_for_ly_set_2 parent;
  lyd_node **first;
  lyd_node *local_60;
  lyd_node *LYD_TREE_DFS_next;
  ly_ht *plStack_50;
  ly_bool LYD_TREE_DFS_continue;
  ly_ht *getnext_ht;
  ly_set node_when;
  lyd_node *node;
  LY_ERR rc;
  lyd_node **diff_local;
  lyd_node *plStack_18;
  uint32_t implicit_options_local;
  lyd_node *tree_local;
  
  plStack_18 = tree;
  memset(&getnext_ht,0,0x10);
  plStack_50 = (ly_ht *)0x0;
  if (plStack_18 == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","tree",
           "lyd_new_implicit_tree");
    tree_local._4_4_ = LY_EINVAL;
  }
  else {
    if (diff != (lyd_node **)0x0) {
      *diff = (lyd_node *)0x0;
    }
    node._4_4_ = lyd_val_getnext_ht_new(&stack0xffffffffffffffb0);
    if (node._4_4_ == LY_SUCCESS) {
      node_when.field_2.dnodes = (lyd_node **)plStack_18;
      while (parent = node_when.field_2, node_when.field_2.dnodes != (lyd_node **)0x0) {
        if ((node_when.field_2.dnodes[1] != (lyd_node *)0x0) &&
           ((node_when.field_2.dnodes[1]->hash & 0x711) != 0)) {
          first = lyd_node_child_p(node_when.field_2.dnodes);
          node._4_4_ = lyd_new_implicit((lyd_node *)parent.dnodes,first,(lysc_node *)0x0,
                                        (lys_module *)0x0,(ly_set *)&getnext_ht,(ly_set *)0x0,
                                        (ly_set *)0x0,implicit_options,plStack_50,diff);
          if (node._4_4_ != LY_SUCCESS) goto LAB_00146624;
        }
        local_60 = lyd_child((lyd_node *)node_when.field_2.dnodes);
        if (local_60 == (lyd_node *)0x0) {
          if ((lyd_node *)node_when.field_2.dnodes == plStack_18) break;
          local_60 = node_when.field_2.dnodes[3];
        }
        while ((local_60 == (lyd_node *)0x0 &&
               (node_when.field_2 =
                     *(anon_union_8_3_0df1e6ad_for_ly_set_2 *)(node_when.field_2.dnodes + 2),
               (lyd_node_inner *)node_when.field_2.dnodes[2] != plStack_18->parent))) {
          local_60 = node_when.field_2.dnodes[3];
        }
        node_when.field_2.dnodes = (lyd_node **)local_60;
      }
      node._4_4_ = lyd_validate_unres(&stack0xffffffffffffffe8,(lys_module *)0x0,LYD_TYPE_DATA_YANG,
                                      (ly_set *)&getnext_ht,1,(ly_set *)0x0,(ly_set *)0x0,
                                      (ly_set *)0x0,(ly_set *)0x0,0,diff);
    }
LAB_00146624:
    ly_set_erase((ly_set *)&getnext_ht,(_func_void_void_ptr *)0x0);
    lyd_val_getnext_ht_free(plStack_50);
    if ((node._4_4_ != LY_SUCCESS) && (diff != (lyd_node **)0x0)) {
      lyd_free_all(*diff);
      *diff = (lyd_node *)0x0;
    }
    tree_local._4_4_ = node._4_4_;
  }
  return tree_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_implicit_tree(struct lyd_node *tree, uint32_t implicit_options, struct lyd_node **diff)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyd_node *node;
    struct ly_set node_when = {0};
    struct ly_ht *getnext_ht = NULL;

    LY_CHECK_ARG_RET(NULL, tree, LY_EINVAL);
    if (diff) {
        *diff = NULL;
    }

    /* create the getnext hash table */
    LY_CHECK_GOTO(rc = lyd_val_getnext_ht_new(&getnext_ht), cleanup);

    LYD_TREE_DFS_BEGIN(tree, node) {
        if (node->schema && (node->schema->nodetype & LYD_NODE_INNER)) {
            LY_CHECK_GOTO(rc = lyd_new_implicit(node, lyd_node_child_p(node), NULL, NULL, &node_when, NULL,
                    NULL, implicit_options, getnext_ht, diff), cleanup);
        }

        LYD_TREE_DFS_END(tree, node);
    }

    /* resolve when and remove any invalid defaults */
    rc = lyd_validate_unres(&tree, NULL, 0, &node_when, LYXP_IGNORE_WHEN, NULL, NULL, NULL, NULL, 0, diff);
    LY_CHECK_GOTO(rc, cleanup);

cleanup:
    ly_set_erase(&node_when, NULL);
    lyd_val_getnext_ht_free(getnext_ht);
    if (rc && diff) {
        lyd_free_all(*diff);
        *diff = NULL;
    }
    return rc;
}